

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * multinomial_mean(int a,int b,double *c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *mean;
  int i;
  double *c_local;
  int b_local;
  int a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)b;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (mean._4_4_ = 0; mean._4_4_ < b; mean._4_4_ = mean._4_4_ + 1) {
    pdVar3[mean._4_4_] = (double)a * c[mean._4_4_];
  }
  return pdVar3;
}

Assistant:

double *multinomial_mean ( int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_MEAN returns the means of the Multinomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//
//    Input, int B, the number of outcomes possible on one trial.
//    1 <= B.
//
//    Input, double C(B).  C(I) is the probability of outcome I on
//    any trial.
//    0.0 <= C(I) <= 1.0,
//    SUM ( 1 <= I <= B) C(I) = 1.0.
//
//    Output, double MEAN(B), MEAN(I) is the expected value of the
//    number of outcome I in N trials.
//
{
  int i;
  double *mean;

  mean = new double[b];

  for ( i = 0; i < b; i++ )
  {
    mean[i] = static_cast<double>(a ) * c[i];
  }

  return mean;
}